

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::propagate_nonuniform_qualifier(CompilerGLSL *this,uint32_t id)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRExpression *pSVar3;
  SPIRCombinedImageSampler *pSVar4;
  SPIRAccessChain *pSVar5;
  TypedID<(spirv_cross::Types)0> *pTVar6;
  TypedID<(spirv_cross::Types)0> *expr_2;
  TypedID<(spirv_cross::Types)0> *__end4;
  TypedID<(spirv_cross::Types)0> *__begin4;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *__range4;
  TypedID<(spirv_cross::Types)0> *expr_1;
  TypedID<(spirv_cross::Types)0> *__end2_1;
  TypedID<(spirv_cross::Types)0> *__begin2_1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *__range2_1;
  TypedID<(spirv_cross::Types)0> *expr;
  TypedID<(spirv_cross::Types)0> *__end2;
  TypedID<(spirv_cross::Types)0> *__begin2;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *__range2;
  SPIRAccessChain *chain;
  SPIRCombinedImageSampler *combined;
  SPIRExpression *e;
  ID local_18;
  uint32_t local_14;
  CompilerGLSL *pCStack_10;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  local_14 = id;
  pCStack_10 = this;
  TypedID<(spirv_cross::Types)0>::TypedID(&local_18,id);
  bVar1 = Compiler::has_decoration(&this->super_Compiler,local_18,DecorationNonUniform);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    TypedID<(spirv_cross::Types)0>::TypedID
              ((TypedID<(spirv_cross::Types)0> *)((long)&e + 4),local_14);
    Compiler::set_decoration(&this->super_Compiler,e._4_4_,DecorationNonUniform,0);
    Compiler::force_recompile(&this->super_Compiler);
  }
  pSVar3 = Compiler::maybe_get<spirv_cross::SPIRExpression>(&this->super_Compiler,local_14);
  pSVar4 = Compiler::maybe_get<spirv_cross::SPIRCombinedImageSampler>
                     (&this->super_Compiler,local_14);
  pSVar5 = Compiler::maybe_get<spirv_cross::SPIRAccessChain>(&this->super_Compiler,local_14);
  if (pSVar3 == (SPIRExpression *)0x0) {
    if (pSVar4 == (SPIRCombinedImageSampler *)0x0) {
      if (pSVar5 != (SPIRAccessChain *)0x0) {
        __end4 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::begin
                           (&(pSVar5->implied_read_expressions).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>);
        pTVar6 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::end
                           (&(pSVar5->implied_read_expressions).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>);
        for (; __end4 != pTVar6; __end4 = __end4 + 1) {
          uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end4);
          propagate_nonuniform_qualifier(this,uVar2);
        }
      }
    }
    else {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar4->image);
      propagate_nonuniform_qualifier(this,uVar2);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar4->sampler);
      propagate_nonuniform_qualifier(this,uVar2);
    }
  }
  else {
    __end2 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::begin
                       (&(pSVar3->expression_dependencies).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>);
    pTVar6 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::end
                       (&(pSVar3->expression_dependencies).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>);
    for (; __end2 != pTVar6; __end2 = __end2 + 1) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end2);
      propagate_nonuniform_qualifier(this,uVar2);
    }
    __end2_1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::begin
                         (&(pSVar3->implied_read_expressions).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>);
    pTVar6 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::end
                       (&(pSVar3->implied_read_expressions).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>);
    for (; __end2_1 != pTVar6; __end2_1 = __end2_1 + 1) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end2_1);
      propagate_nonuniform_qualifier(this,uVar2);
    }
  }
  return;
}

Assistant:

void CompilerGLSL::propagate_nonuniform_qualifier(uint32_t id)
{
	// SPIR-V might only tag the very last ID with NonUniformEXT, but for codegen,
	// we need to know NonUniformEXT a little earlier, when the resource is actually loaded.
	// Back-propagate the qualifier based on the expression dependency chain.

	if (!has_decoration(id, DecorationNonUniformEXT))
	{
		set_decoration(id, DecorationNonUniformEXT);
		force_recompile();
	}

	auto *e = maybe_get<SPIRExpression>(id);
	auto *combined = maybe_get<SPIRCombinedImageSampler>(id);
	auto *chain = maybe_get<SPIRAccessChain>(id);
	if (e)
	{
		for (auto &expr : e->expression_dependencies)
			propagate_nonuniform_qualifier(expr);
		for (auto &expr : e->implied_read_expressions)
			propagate_nonuniform_qualifier(expr);
	}
	else if (combined)
	{
		propagate_nonuniform_qualifier(combined->image);
		propagate_nonuniform_qualifier(combined->sampler);
	}
	else if (chain)
	{
		for (auto &expr : chain->implied_read_expressions)
			propagate_nonuniform_qualifier(expr);
	}
}